

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O3

void __thiscall
QProxyStyle::drawItemPixmap
          (QProxyStyle *this,QPainter *painter,QRect *rect,int alignment,QPixmap *pixmap)

{
  QProxyStylePrivate *this_00;
  QObject *pQVar1;
  
  this_00 = *(QProxyStylePrivate **)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  QProxyStylePrivate::ensureBaseStyle(this_00);
  pQVar1 = (this_00->baseStyle).wp.value;
  (**(code **)(*(long *)pQVar1 + 0xa0))(pQVar1,painter,rect,alignment,pixmap);
  return;
}

Assistant:

void QProxyStyle::drawItemPixmap(QPainter *painter, const QRect &rect, int alignment, const QPixmap &pixmap) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    d->baseStyle->drawItemPixmap(painter, rect, alignment, pixmap);
}